

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GED_BasicRotorWingAircraft.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::GED_BasicRotorWingAircraft::Decode
          (GED_BasicRotorWingAircraft *this,KDataStream *stream)

{
  KUINT16 KVar1;
  KException *this_00;
  KDataStream *pKVar2;
  allocator<char> local_39;
  KString local_38;
  KDataStream *local_18;
  KDataStream *stream_local;
  GED_BasicRotorWingAircraft *this_local;
  
  local_18 = stream;
  stream_local = (KDataStream *)this;
  KVar1 = KDataStream::GetBufferSize(stream);
  if (KVar1 < 0x18) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Decode",&local_39);
    KException::KException(this_00,&local_38,2);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  GED_BasicFixedWingAircraft::Decode(&this->super_GED_BasicFixedWingAircraft,local_18);
  pKVar2 = KDataStream::operator>>(local_18,&this->m_i8TrrtAz);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_i8GnElv);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_i8TrrtSlwRt);
  KDataStream::operator>>(pKVar2,&this->m_i8GnElvRt);
  return;
}

Assistant:

void GED_BasicRotorWingAircraft::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < GED_BASIC_ROTOR_WING_AIRCRAFT_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    GED_BasicFixedWingAircraft::Decode( stream );

    stream >> m_i8TrrtAz
           >> m_i8GnElv
           >> m_i8TrrtSlwRt
           >> m_i8GnElvRt;
}